

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstar.cpp
# Opt level: O0

bool __thiscall
GMAA_MAAstar::ConstructAndValuateNextPolicies
          (GMAA_MAAstar *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  MultiAgentDecisionProcessInterface *pMVar1;
  bool bVar2;
  int iVar3;
  Index IVar4;
  type pPVar5;
  type pPVar6;
  size_t sVar7;
  size_t sVar8;
  ostream *poVar9;
  ulong uVar10;
  undefined4 extraout_var;
  LIndex i;
  reference pvVar11;
  type pBVar12;
  type pPVar13;
  type pJVar14;
  type pPVar15;
  undefined8 uVar16;
  undefined1 *in_RCX;
  shared_ptr<PartialPolicyPoolInterface> *in_RDX;
  shared_ptr<PartialPolicyPoolItemInterface> *in_RSI;
  PlanningUnit *in_RDI;
  double dVar17;
  double dVar18;
  double extraout_XMM0_Qa;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar19 [16];
  undefined1 extraout_var_00 [56];
  stringstream ss_2;
  double oldValue;
  double newValue;
  double newPastreward;
  double prevPastReward;
  double immR;
  double discounted_F;
  double discountToThePowerT;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts;
  Index agI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  PJPDP_sharedPtr jpolTs;
  JPPV_sharedPtr bgpol;
  bool foundCBGsolution;
  shared_ptr<JointPolicyDiscretePure> jpdp;
  double val;
  stringstream ss;
  stringstream ss_1;
  shared_ptr<BayesianGameIdenticalPayoffSolver> bgips;
  shared_ptr<BGIP_IncrementalSolverInterface> bgipIncSolver;
  shared_ptr<const_BayesianGameForDecPOMDPStage> bg_ts;
  bool is_last_ts;
  size_t ts;
  PJPDP_sharedPtr jpolPrevTs;
  Index in_stack_fffffffffffff5f8;
  Index in_stack_fffffffffffff5fc;
  byte bVar21;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffff600;
  TimedAlgorithm *this_00;
  shared_ptr<const_BayesianGameForDecPOMDPStage> *in_stack_fffffffffffff608;
  shared_ptr<const_BayesianGameForDecPOMDPStage> *in_stack_fffffffffffff610;
  BayesianGameForDecPOMDPStage *in_stack_fffffffffffff618;
  undefined7 in_stack_fffffffffffff620;
  undefined1 in_stack_fffffffffffff627;
  char *in_stack_fffffffffffff628;
  E *in_stack_fffffffffffff630;
  BGIP_IncrementalSolverInterface *in_stack_fffffffffffff638;
  shared_ptr<BayesianGameIdenticalPayoffSolver> *in_stack_fffffffffffff660;
  shared_ptr<PartialPolicyPoolItemInterface> *in_stack_fffffffffffff668;
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete *in_stack_fffffffffffff670;
  shared_ptr<const_PartialJointPolicyDiscretePure> *in_stack_fffffffffffff678;
  QFunctionJAOHInterface *in_stack_fffffffffffff680;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffff688;
  BayesianGameForDecPOMDPStage *in_stack_fffffffffffff690;
  string local_730 [32];
  string local_710 [32];
  stringstream local_6f0 [16];
  ostream local_6e0 [376];
  double local_568;
  undefined1 local_560 [16];
  double local_550;
  double local_548;
  double local_540;
  shared_ptr<JointPolicyDiscretePure> local_530;
  double local_520;
  double local_518;
  double local_510;
  undefined1 local_508 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_4f8;
  uint local_4f0;
  undefined1 local_4e8 [24];
  shared_ptr<PartialJointPolicyDiscretePure> local_4d0;
  shared_ptr<JointPolicyPureVector> local_4c0;
  undefined1 local_4a9;
  double local_498;
  string local_490 [32];
  stringstream local_470 [16];
  ostream local_460 [424];
  undefined1 local_2b8 [24];
  shared_ptr<BayesianGameIdenticalPayoffSolver> local_2a0 [2];
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_278 [2];
  string local_258 [32];
  stringstream local_238 [16];
  ostream local_228 [382];
  undefined1 local_aa;
  shared_ptr<const_PartialJointPolicyDiscretePure> local_a8 [2];
  undefined1 local_88 [32];
  shared_ptr<BGIP_IncrementalSolverInterface> local_68;
  shared_ptr<const_BayesianGameForDecPOMDPStage> local_58;
  byte local_45;
  size_t local_38;
  shared_ptr<PartialJointPolicyDiscretePure> local_30;
  undefined1 *local_20;
  shared_ptr<PartialPolicyPoolInterface> *local_18;
  shared_ptr<PartialPolicyPoolItemInterface> *local_10;
  undefined1 auVar20 [64];
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(in_RSI);
  (*pPVar5->_vptr_PartialPolicyPoolItemInterface[2])();
  pPVar6 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
  sVar7 = JointPolicy::GetDepth((JointPolicy *)pPVar6);
  local_38 = sVar7;
  sVar8 = PlanningUnit::GetHorizon(in_RDI);
  local_45 = sVar7 == sVar8 - 1;
  boost::shared_ptr<const_BayesianGameForDecPOMDPStage>::shared_ptr
            ((shared_ptr<const_BayesianGameForDecPOMDPStage> *)0x965e80);
  boost::shared_ptr<BGIP_IncrementalSolverInterface>::shared_ptr
            ((shared_ptr<BGIP_IncrementalSolverInterface> *)0x965e8d);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x965e9a);
  pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
  (*pPVar5->_vptr_PartialPolicyPoolItemInterface[5])(local_88);
  bVar2 = boost::operator==((shared_ptr<BayesianGameIdenticalPayoffSolver> *)
                            in_stack_fffffffffffff600,
                            (sp_nullptr_t)
                            CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x965ef1);
  if (bVar2) {
    if (7 < *(int *)&in_RDI[0x16]._m_problem) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "GMAA_MAAstar: I have not expanded this ppi before...");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    operator_new(0x150);
    local_aa = 1;
    boost::shared_ptr<const_PartialJointPolicyDiscretePure>::
    shared_ptr<PartialJointPolicyDiscretePure>(local_a8,&local_30);
    BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
              (in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff680,
               in_stack_fffffffffffff678);
    local_aa = 0;
    boost::shared_ptr<BayesianGameForDecPOMDPStage>::shared_ptr<BayesianGameForDecPOMDPStage>
              ((shared_ptr<BayesianGameForDecPOMDPStage> *)
               CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
               in_stack_fffffffffffff618);
    boost::shared_ptr<BayesianGameForDecPOMDPStage_const>::operator=
              ((shared_ptr<const_BayesianGameForDecPOMDPStage> *)
               CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
               (shared_ptr<BayesianGameForDecPOMDPStage> *)in_stack_fffffffffffff618);
    boost::shared_ptr<BayesianGameForDecPOMDPStage>::~shared_ptr
              ((shared_ptr<BayesianGameForDecPOMDPStage> *)0x966039);
    boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x966046);
    in_RDI[0x17]._m_horizon = in_RDI[0x17]._m_horizon + 1;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff600,
                            (char *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    if (bVar2) {
      std::__cxx11::stringstream::stringstream(local_238);
      poVar9 = std::operator<<(local_228,(string *)&in_RDI[0x17]._m_seed);
      std::ostream::operator<<(poVar9,in_RDI[0x17]._m_horizon);
      boost::shared_ptr<const_BayesianGameForDecPOMDPStage>::operator*(&local_58);
      std::__cxx11::stringstream::str();
      BayesianGameIdenticalPayoff::Save
                ((BayesianGameIdenticalPayoff *)in_stack_fffffffffffff600,
                 (string *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
      std::__cxx11::string::~string(local_258);
      std::__cxx11::stringstream::~stringstream(local_238);
    }
    pMVar1 = in_RDI[0x1b]._m_problem;
    boost::shared_ptr<BayesianGameIdenticalPayoffInterface_const>::
    shared_ptr<BayesianGameForDecPOMDPStage_const>(local_278,&local_58);
    (*pMVar1->_vptr_MultiAgentDecisionProcessInterface[2])(pMVar1,local_278);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
    shared_ptr<BayesianGameIdenticalPayoffSolver>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)
               CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
               (BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffff618);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_fffffffffffff610,
               (shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_fffffffffffff608);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x966273);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x966280);
    boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface,BayesianGameIdenticalPayoffSolver>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_fffffffffffff618);
    boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator=
              ((shared_ptr<BGIP_IncrementalSolverInterface> *)in_stack_fffffffffffff610,
               (shared_ptr<BGIP_IncrementalSolverInterface> *)in_stack_fffffffffffff608);
    boost::shared_ptr<BGIP_IncrementalSolverInterface>::~shared_ptr
              ((shared_ptr<BGIP_IncrementalSolverInterface> *)0x9662b7);
    bVar2 = boost::operator==((shared_ptr<BGIP_IncrementalSolverInterface> *)
                              in_stack_fffffffffffff600,
                              (sp_nullptr_t)
                              CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    if (bVar2) {
      uVar16 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      __cxa_throw(uVar16,&E::typeinfo,E::~E);
    }
    if ((local_45 & 1) == 0) {
      boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator->(&local_68);
      sVar7 = BayesianGameIdenticalPayoffSolver::GetNrDesiredSolutions
                        ((BayesianGameIdenticalPayoffSolver *)0x966407);
      if (sVar7 != 0x7fffffff) {
        uVar16 = __cxa_allocate_exception(0x28);
        E::E(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
        __cxa_throw(uVar16,&E::typeinfo,E::~E);
      }
    }
    else {
      boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator->(&local_68);
      BayesianGameIdenticalPayoffSolver::SetNrDesiredSolutions
                ((BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffff600,
                 CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
      if (3 < *(int *)&in_RDI[0x16]._m_problem) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Last stage - set nr solutions to 1");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
    }
    pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
    shared_ptr<BGIP_IncrementalSolverInterface>(local_2a0,&local_68);
    (*pPVar5->_vptr_PartialPolicyPoolItemInterface[7])(pPVar5,local_2a0);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x9664eb);
  }
  else {
    if (7 < *(int *)&in_RDI[0x16]._m_problem) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "GMAA_MAAstar: ppi was expanded before, getting the previous BGIPSolver..."
                              );
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
    (*pPVar5->_vptr_PartialPolicyPoolItemInterface[5])(local_2b8);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_fffffffffffff610,
               (shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_fffffffffffff608);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x9665b0);
    boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface,BayesianGameIdenticalPayoffSolver>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_fffffffffffff618);
    boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator=
              ((shared_ptr<BGIP_IncrementalSolverInterface> *)in_stack_fffffffffffff610,
               (shared_ptr<BGIP_IncrementalSolverInterface> *)in_stack_fffffffffffff608);
    boost::shared_ptr<BGIP_IncrementalSolverInterface>::~shared_ptr
              ((shared_ptr<BGIP_IncrementalSolverInterface> *)0x9665e7);
    bVar2 = boost::operator==((shared_ptr<BGIP_IncrementalSolverInterface> *)
                              in_stack_fffffffffffff600,
                              (sp_nullptr_t)
                              CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    if (bVar2) {
      uVar16 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      __cxa_throw(uVar16,&E::typeinfo,E::~E);
    }
    boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator->(&local_68);
    BayesianGameIdenticalPayoffSolver::GetBGIPI
              ((BayesianGameIdenticalPayoffSolver *)
               CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    boost::
    dynamic_pointer_cast<BayesianGameForDecPOMDPStage_const,BayesianGameIdenticalPayoffInterface_const>
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)in_stack_fffffffffffff618);
    boost::shared_ptr<const_BayesianGameForDecPOMDPStage>::operator=
              (in_stack_fffffffffffff610,in_stack_fffffffffffff608);
    boost::shared_ptr<const_BayesianGameForDecPOMDPStage>::~shared_ptr
              ((shared_ptr<const_BayesianGameForDecPOMDPStage> *)0x9666cf);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x9666dc);
    bVar2 = boost::operator==((shared_ptr<const_BayesianGameForDecPOMDPStage> *)
                              in_stack_fffffffffffff600,
                              (sp_nullptr_t)
                              CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    if (bVar2) {
      uVar16 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      __cxa_throw(uVar16,&E::typeinfo,E::~E);
    }
  }
  std::__cxx11::stringstream::stringstream(local_470);
  poVar9 = std::operator<<(local_460,"GMAA_MAAstar::NextExact_ts");
  std::ostream::operator<<(poVar9,local_38);
  std::__cxx11::stringstream::str();
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffff600,
             (string *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  std::__cxx11::string::~string(local_490);
  auVar20._8_56_ = extraout_var_00;
  auVar20._0_8_ = extraout_XMM1_Qa;
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660);
  boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x966822);
  boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator->(&local_68);
  local_4a9 = BGIP_IncrementalSolverInterface::GetNextJointPolicyAndValue
                        ((BGIP_IncrementalSolverInterface *)in_stack_fffffffffffff600,
                         (shared_ptr<JointPolicyDiscretePure> *)
                         CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8),
                         (double *)0x966856);
  if ((bool)local_4a9) {
    boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
              ((shared_ptr<JointPolicyDiscretePure> *)in_stack_fffffffffffff618);
    bVar2 = boost::operator==((shared_ptr<JointPolicyPureVector> *)in_stack_fffffffffffff600,
                              (sp_nullptr_t)
                              CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    if (bVar2) {
      uVar16 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffff630,in_stack_fffffffffffff628);
      __cxa_throw(uVar16,&E::typeinfo,E::~E);
    }
    boost::shared_ptr<PartialJointPolicyDiscretePure>::shared_ptr
              ((shared_ptr<PartialJointPolicyDiscretePure> *)0x966996);
    (*in_RDI->_vptr_PlanningUnit[6])();
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9669c6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT17(in_stack_fffffffffffff627,in_stack_fffffffffffff620),
               (size_type)in_stack_fffffffffffff618,(allocator_type *)in_stack_fffffffffffff610);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9669f2);
    local_4f0 = 0;
    while( true ) {
      uVar10 = (ulong)local_4f0;
      iVar3 = (*in_RDI->_vptr_PlanningUnit[6])();
      auVar19 = auVar20._0_16_;
      if (CONCAT44(extraout_var,iVar3) <= uVar10) break;
      i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                    (in_stack_fffffffffffff600,in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8);
      IVar4 = Globals::CastLIndexToIndex(i);
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffff600,
                           CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
      *pvVar11 = IVar4;
      local_4f0 = local_4f0 + 1;
    }
    pBVar12 = boost::shared_ptr<const_BayesianGameForDecPOMDPStage>::operator->(&local_58);
    local_4f8 = BayesianGameBase::GetNrTypes
                          ((BayesianGameBase *)&pBVar12->super_BayesianGameIdenticalPayoff);
    pPVar13 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator*(&local_30);
    pJVar14 = boost::shared_ptr<JointPolicyPureVector>::operator*(&local_4c0);
    (*in_RDI->_vptr_PlanningUnit[0x18])(local_508,in_RDI,pPVar13,pJVar14,local_4f8,local_4e8);
    boost::shared_ptr<PartialJointPolicyDiscretePure>::operator=
              ((shared_ptr<PartialJointPolicyDiscretePure> *)in_stack_fffffffffffff610,
               (shared_ptr<PartialJointPolicyDiscretePure> *)in_stack_fffffffffffff608);
    boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<PartialJointPolicyDiscretePure> *)0x966bff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff610);
    dVar17 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x966c19);
    auVar19 = vcvtusi2sd_avx512f(auVar19,local_38);
    local_510 = pow(dVar17,auVar19._0_8_);
    dVar17 = local_510 * local_498;
    local_518 = dVar17;
    pBVar12 = boost::shared_ptr<const_BayesianGameForDecPOMDPStage>::operator->(&local_58);
    boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr<JointPolicyPureVector>
              (&local_530,&local_4c0);
    (*(pBVar12->super_BayesianGameForDecPOMDPStageInterface).
      _vptr_BayesianGameForDecPOMDPStageInterface[5])(pBVar12,&local_530,0);
    boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<JointPolicyDiscretePure> *)0x966cce);
    local_520 = dVar17;
    pPVar6 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
    local_540 = PartialJointPolicy::GetPastReward(&pPVar6->super_PartialJointPolicy);
    pPVar6 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
    local_548 = PartialJointPolicy::GetPastReward(&pPVar6->super_PartialJointPolicy);
    local_548 = local_548 + local_520;
    pPVar6 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_4d0);
    PartialJointPolicy::SetPastReward(&pPVar6->super_PartialJointPolicy,local_548);
    if ((local_45 & 1) == 0) {
      local_550 = local_540 + local_518;
    }
    else {
      local_550 = local_548;
    }
    pPVar15 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_18);
    dVar17 = local_550;
    (*in_RDI->_vptr_PlanningUnit[0x16])(local_560,in_RDI,&local_4d0);
    (*pPVar15->_vptr_PartialPolicyPoolInterface[8])(pPVar15,local_560);
    boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
              ((shared_ptr<PartialPolicyPoolItemInterface> *)0x966e77);
    if (local_38 != 0) {
      pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
      (*pPVar5->_vptr_PartialPolicyPoolItemInterface[3])();
      local_568 = dVar17;
      pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
      (*pPVar5->_vptr_PartialPolicyPoolItemInterface[4])(local_550);
      dVar18 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x966f0b);
      dVar17 = local_568;
      if ((dVar18 == 1.0) && (!NAN(dVar18))) {
        dVar18 = local_568;
        pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
        (*pPVar5->_vptr_PartialPolicyPoolItemInterface[3])();
        if (dVar17 < dVar18) {
          pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
          (*pPVar5->_vptr_PartialPolicyPoolItemInterface[3])();
          bVar2 = Globals::EqualReward
                            ((double)in_stack_fffffffffffff600,
                             (double)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          if (!bVar2) {
            std::__cxx11::stringstream::stringstream(local_6f0);
            poVar9 = std::operator<<(local_6e0,
                                     "GMAA_MAAstar value of parent can only go down when being updated: old value="
                                    );
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_568);
            dVar17 = extraout_XMM0_Qa;
            poVar9 = std::operator<<(poVar9," new value=");
            pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
            (*pPVar5->_vptr_PartialPolicyPoolItemInterface[3])();
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,dVar17);
            poVar9 = std::operator<<(poVar9," old-new=");
            dVar17 = local_568;
            dVar18 = local_568;
            pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
            (*pPVar5->_vptr_PartialPolicyPoolItemInterface[3])();
            std::ostream::operator<<(poVar9,dVar17 - dVar18);
            uVar16 = __cxa_allocate_exception(0x28);
            E::E((E *)in_stack_fffffffffffff600,
                 (stringstream *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
            __cxa_throw(uVar16,&E::typeinfo,E::~E);
          }
        }
      }
    }
    boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<PartialJointPolicyDiscretePure> *)0x9671e6);
    boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
              ((shared_ptr<JointPolicyPureVector> *)0x9671f3);
  }
  else {
    if (0 < *(int *)&in_RDI[0x16]._m_problem) {
      in_stack_fffffffffffff638 =
           (BGIP_IncrementalSolverInterface *)
           std::operator<<((ostream *)&std::cout,
                           "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver")
      ;
      std::ostream::operator<<(in_stack_fffffffffffff638,std::endl<char,std::char_traits<char>>);
    }
    pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
    (*pPVar5->_vptr_PartialPolicyPoolItemInterface[4])(0xffefffffffffffff);
  }
  boost::shared_ptr<BGIP_IncrementalSolverInterface>::operator->(&local_68);
  bVar2 = BGIP_IncrementalSolverInterface::AllSolutionsHaveBeenReturned(in_stack_fffffffffffff638);
  if (bVar2) {
    if (3 < *(int *)&in_RDI[0x16]._m_problem) {
      poVar9 = std::operator<<((ostream *)&std::cout,"AllSolutionsHaveBeenReturned, removing ");
      pPVar6 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
      (*(pPVar6->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[6])(local_710);
      poVar9 = std::operator<<(poVar9,local_710);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_710);
    }
    *local_20 = 1;
  }
  else {
    *local_20 = 0;
  }
  this_00 = (TimedAlgorithm *)&in_RDI[0x14]._m_horizon;
  std::__cxx11::stringstream::str();
  TimedAlgorithm::StopTimer
            (this_00,(string *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  std::__cxx11::string::~string(local_730);
  bVar21 = local_45;
  boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x9673ed);
  std::__cxx11::stringstream::~stringstream(local_470);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x967407);
  boost::shared_ptr<BGIP_IncrementalSolverInterface>::~shared_ptr
            ((shared_ptr<BGIP_IncrementalSolverInterface> *)0x967414);
  boost::shared_ptr<const_BayesianGameForDecPOMDPStage>::~shared_ptr
            ((shared_ptr<const_BayesianGameForDecPOMDPStage> *)0x967421);
  boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<PartialJointPolicyDiscretePure> *)0x96742e);
  return (bool)(bVar21 & 1);
}

Assistant:

bool GMAA_MAAstar::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI) 
{
    PJPDP_sharedPtr jpolPrevTs = ppi->GetJPol();//jpol^ts-1
    size_t ts = jpolPrevTs->GetDepth();     // = depth = ts(jpolPrevTs) + 1
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    //the BG pointer
    boost::shared_ptr<const BayesianGameForDecPOMDPStage> bg_ts;
    //the solver pointers
    //boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVector> > bgipIncSolver;
    //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> > bgips;
    boost::shared_ptr<BGIP_IncrementalSolverInterface> bgipIncSolver;
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgips;
    // Check whether we already considered this
    // PartialJointPolicyDiscretePure before, in which case the
    // BayesianGameForDecPOMDPStage and the BGIPSolver have already
    // been generated
    if(ppi->GetBGIPSolverPointer()==0)
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstar: I have not expanded this ppi before..." << endl;

        // Construct the bayesian game for this timestep - 
        bg_ts= boost::shared_ptr<BayesianGameForDecPOMDPStage> (
            new BayesianGameForDecPOMDPStage(
                this,
                _m_qHeuristic,
                jpolPrevTs
                ));
        // not sure this pays off in terms of time vs space...
//        bg_ts->ComputeAllImmediateRewards();

        // save the BG to disk in case the user requested it
        _m_bgCounter++;
        if(_m_bgBaseFilename!="")
        {
            stringstream ss;
            ss << _m_bgBaseFilename << _m_bgCounter;
            BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
        }

        // keep track of every bg_ts we instantiate, so we can clean
        // them up after solving
//        _m_pointersToAllBGTS.push_back(bg_ts);

        //create the Bayesian game solver
        bgips =
            boost::shared_ptr<
            BayesianGameIdenticalPayoffSolver/*_T<JointPolicyPureVector>*/
            >( (*_m_newBGIP_Solver)(bg_ts) );
        bgipIncSolver = boost::dynamic_pointer_cast<
            BGIP_IncrementalSolverInterface/*_T<JointPolicyPureVector>*/ > (bgips);
        if(bgipIncSolver==0)
            throw(E("GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers"));

        if(is_last_ts)
        {
            //For the last stage we only want 1 solution.
            bgipIncSolver->SetNrDesiredSolutions(1);
            if(_m_verboseness >= 4)
                std::cout << "Last stage - set nr solutions to 1"<<endl;
        }
        else if(bgipIncSolver->GetNrDesiredSolutions()!=INT_MAX)
            throw(E("GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)"));

        // associate the resulting incremental BGIPSolver with this
        // PPI, so that we can reuse it
        ppi->SetBGIPSolverPointer(bgipIncSolver);
    }
    else
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstar: ppi was expanded before, getting the previous BGIPSolver..." << endl;
        bgips = ppi->GetBGIPSolverPointer();           
        bgipIncSolver= boost::dynamic_pointer_cast<
            BGIP_IncrementalSolverInterface/*_T<JointPolicyPureVector> */
            > (bgips);
        if(bgipIncSolver==0)
            throw(E("GMAA_MAAstar requires BGIP_IncrementalSolverInterface solvers"));
        bg_ts = boost::dynamic_pointer_cast<const BayesianGameForDecPOMDPStage>(bgipIncSolver->GetBGIPI());
        if(bg_ts==0)
            throw(E("GMAA_MAAstar BG is not of the correct type"));
    }

    stringstream ss;
    ss << "GMAA_MAAstar::NextExact_ts" << ts;
    StartTimer(ss.str());

    // Compute bounds on the value solving this CBG can result in
    this->GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds(ppi,bgips);

    // Ask the BGIPSolver for the next solution, which might not exist
    // due to the bounds on the value of the solution
    double val;
    boost::shared_ptr<JointPolicyDiscretePure> jpdp;
    /// Calling the BGIPSolver
    bool foundCBGsolution = bgipIncSolver->GetNextJointPolicyAndValue(jpdp, val);

    if(foundCBGsolution)
    {
        JPPV_sharedPtr bgpol = boost::dynamic_pointer_cast<JointPolicyPureVector>(jpdp);
        if(bgpol==0)
            throw(E("GMAA_MAAstar we did not get a valid policy from the incremental BGIP solver"));

        //Frans 20110908: what kind of construction is this: 
        PJPDP_sharedPtr jpolTs;
        {
            vector<Index> firstOHtsI(GetNrAgents());
            for(Index agI=0; agI < GetNrAgents(); agI++)
                firstOHtsI.at(agI) = 
                    CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));

            const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
            jpolTs = ConstructExtendedJointPolicy(*jpolPrevTs,
                                                  *bgpol,
                                                  nrOHts,
                                                  firstOHtsI);
        }
        //??? why the indented block?!
        
        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;
        
        //compute expected immediate reward for this stage
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        double prevPastReward = jpolPrevTs->GetPastReward();
        double newPastreward = jpolPrevTs->GetPastReward() + immR;
        jpolTs->SetPastReward(newPastreward);
        
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue = newPastreward;
        else
            newValue = prevPastReward + discounted_F;

        //push this policy and value on the priority queue
        poolOfNextPolicies->Insert( NewPPI(jpolTs,newValue) );

#if DEBUG_GMAA4
        cout <<"v = pastReward_prevTs + g^t * f = "
             << newValue <<" = "
             << jpolPrevTs->GetPastReward() <<" + "
             << discounted_F << "   "
             << "(g^t * f ="<<discountToThePowerT << " * " << val << ")"
             << endl;
#endif

        if(ts>0)
        {
            double oldValue=ppi->GetValue();
            // now we update the current PPI with the value of the next sibling
            // other option is the value of this child
//          ppi->SetValue(bgipIncSolver->GetPayoff());
            ppi->SetValue(newValue);

            if(GetDiscount()==1.0 &&
               oldValue < ppi->GetValue() &&
               !EqualReward(oldValue, ppi->GetValue()))
            {
                stringstream ss;
                ss << "GMAA_MAAstar value of parent can only go down when being updated: old value="
                   << oldValue << " new value=" << ppi->GetValue()
                   << " old-new=" << oldValue-ppi->GetValue();
                throw(E(ss));
            }
        }
    }
    else // we did NOT get a valid solution from this CBG
    {
        if(_m_verboseness >= 1)
            cout << "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"<< endl;

        // as we didn't any solution for the CBG, we know this branch
        // of the tree can never contain the optimal policy, so we set
        // its value very low
        ppi->SetValue(-DBL_MAX);
    }
    
    // if we returned all solutions from this BG, it has to be deleted
    // from the policy pool
    if(bgipIncSolver->AllSolutionsHaveBeenReturned())
    {
        if(_m_verboseness >= 4)
            cout << "AllSolutionsHaveBeenReturned, removing " << jpolPrevTs->SoftPrint()
                 << endl;
        cleanUpPPI=true;
    }
    else
        cleanUpPPI=false;

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}